

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O0

int luaD_precall(lua_State *L,StkId func,int nresults)

{
  Proto *p_00;
  uint uVar1;
  int iVar2;
  long lVar3;
  StkId pTVar4;
  CallInfo *local_70;
  CallInfo *local_68;
  Proto *p;
  StkId base;
  ptrdiff_t funcr;
  int n;
  CallInfo *ci;
  lua_CFunction f;
  StkId pTStack_20;
  int nresults_local;
  StkId func_local;
  lua_State *L_local;
  
  lVar3 = (long)func - (long)L->stack;
  uVar1 = func->tt_ & 0x3f;
  if (uVar1 == 6) {
    p_00 = *(Proto **)((func->value_).f + 0x18);
    funcr._4_4_ = (int)((long)L->top - (long)func >> 4) + -1;
    if ((long)L->stack_last - (long)L->top >> 4 <= (long)(ulong)p_00->maxstacksize) {
      luaD_growstack(L,(uint)p_00->maxstacksize);
    }
    for (; funcr._4_4_ < (int)(uint)p_00->numparams; funcr._4_4_ = funcr._4_4_ + 1) {
      pTVar4 = L->top;
      L->top = pTVar4 + 1;
      pTVar4->tt_ = 0;
    }
    if (p_00->is_vararg == '\0') {
      pTStack_20 = (StkId)((long)L->stack + lVar3);
      p = (Proto *)(pTStack_20 + 1);
    }
    else {
      p = (Proto *)adjust_varargs(L,p_00,funcr._4_4_);
      pTStack_20 = (StkId)((long)L->stack + lVar3);
    }
    if (L->ci->next == (CallInfo *)0x0) {
      local_70 = luaE_extendCI(L);
    }
    else {
      local_70 = L->ci->next;
    }
    L->ci = local_70;
    local_70->nresults = (short)nresults;
    local_70->func = pTStack_20;
    (local_70->u).l.base = (StkId)p;
    local_70->top = (StkId)(&p->next + (long)(int)(uint)p_00->maxstacksize * 2);
    (local_70->u).l.savedpc = p_00->code;
    local_70->callstatus = '\x01';
    L->top = local_70->top;
    if (0 < L->l_G->GCdebt) {
      luaC_step(L);
    }
    if ((L->hookmask & 1) != 0) {
      callhook(L,local_70);
    }
    L_local._4_4_ = 0;
  }
  else {
    if (uVar1 == 0x16) {
      ci = (CallInfo *)(func->value_).gc;
    }
    else {
      if (uVar1 != 0x26) {
        pTVar4 = tryfuncTM(L,func);
        iVar2 = luaD_precall(L,pTVar4,nresults);
        return iVar2;
      }
      ci = *(CallInfo **)((func->value_).f + 0x18);
    }
    if ((long)L->stack_last - (long)L->top >> 4 < 0x15) {
      luaD_growstack(L,0x14);
    }
    if (L->ci->next == (CallInfo *)0x0) {
      local_68 = luaE_extendCI(L);
    }
    else {
      local_68 = L->ci->next;
    }
    L->ci = local_68;
    local_68->nresults = (short)nresults;
    local_68->func = (StkId)((long)L->stack + lVar3);
    local_68->top = L->top + 0x14;
    local_68->callstatus = '\0';
    if (0 < L->l_G->GCdebt) {
      luaC_step(L);
    }
    if ((L->hookmask & 1) != 0) {
      luaD_hook(L,0,-1);
    }
    iVar2 = (*(code *)ci)(L);
    luaD_poscall(L,L->top + -(long)iVar2);
    L_local._4_4_ = 1;
  }
  return L_local._4_4_;
}

Assistant:

int luaD_precall (lua_State *L, StkId func, int nresults) {
  lua_CFunction f;
  CallInfo *ci;
  int n;  /* number of arguments (Lua) or returns (C) */
  ptrdiff_t funcr = savestack(L, func);
  switch (ttype(func)) {
    case LUA_TLCF:  /* light C function */
      f = fvalue(func);
      goto Cfunc;
    case LUA_TCCL: {  /* C closure */
      f = clCvalue(func)->f;
     Cfunc:
      luaD_checkstack(L, LUA_MINSTACK);  /* ensure minimum stack size */
      ci = next_ci(L);  /* now 'enter' new function */
      ci->nresults = nresults;
      ci->func = restorestack(L, funcr);
      ci->top = L->top + LUA_MINSTACK;
      lua_assert(ci->top <= L->stack_last);
      ci->callstatus = 0;
      luaC_checkGC(L);  /* stack grow uses memory */
      if (L->hookmask & LUA_MASKCALL)
        luaD_hook(L, LUA_HOOKCALL, -1);
      lua_unlock(L);
      n = (*f)(L);  /* do the actual call */
      lua_lock(L);
      api_checknelems(L, n);
      luaD_poscall(L, L->top - n);
      return 1;
    }
    case LUA_TLCL: {  /* Lua function: prepare its call */
      StkId base;
      Proto *p = clLvalue(func)->p;
      n = cast_int(L->top - func) - 1;  /* number of real arguments */
      luaD_checkstack(L, p->maxstacksize);
      for (; n < p->numparams; n++)
        setnilvalue(L->top++);  /* complete missing arguments */
      if (!p->is_vararg) {
        func = restorestack(L, funcr);
        base = func + 1;
      }
      else {
        base = adjust_varargs(L, p, n);
        func = restorestack(L, funcr);  /* previous call can change stack */
      }
      ci = next_ci(L);  /* now 'enter' new function */
      ci->nresults = nresults;
      ci->func = func;
      ci->u.l.base = base;
      ci->top = base + p->maxstacksize;
      lua_assert(ci->top <= L->stack_last);
      ci->u.l.savedpc = p->code;  /* starting point */
      ci->callstatus = CIST_LUA;
      L->top = ci->top;
      luaC_checkGC(L);  /* stack grow uses memory */
      if (L->hookmask & LUA_MASKCALL)
        callhook(L, ci);
      return 0;
    }
    default: {  /* not a function */
      func = tryfuncTM(L, func);  /* retry with 'function' tag method */
      return luaD_precall(L, func, nresults);  /* now it must be a function */
    }
  }
}